

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
CHECK_BELLMAN_FORD(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *G,int *s,
                  WeightMap *weight,vector<unsigned_long,_std::allocator<unsigned_long>_> *pred,
                  vector<long,_std::allocator<long>_> *dist)

{
  allocator<bool> *this;
  int iVar1;
  value_type vVar2;
  long lVar3;
  key_type e;
  key_type e_00;
  key_type e_01;
  vector<long,_std::allocator<long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  type_conflict1 tVar5;
  bool bVar6;
  vertices_size_type vVar7;
  reference __n;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference rVar11;
  reference pvVar12;
  int *piVar13;
  unsigned_long uVar14;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>
  *g_;
  reference rVar15;
  value_type local_390;
  value_type local_378;
  value_type local_360;
  value_type local_348;
  unsigned_long local_330;
  Vertex w_2;
  unsigned_long local_310;
  Vertex v_1;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_2f8;
  undefined1 local_268 [8];
  EdgeIterator ei_end;
  EdgeIterator ei;
  unsigned_long uStack_1d0;
  property_type *local_1c8;
  long local_198;
  long cycle_length;
  Vertex w_1;
  pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>
  local_178;
  size_type local_168;
  Vertex z;
  value_type vStack_158;
  int t;
  Vertex w;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> S;
  pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>
  local_f0;
  reference local_e0;
  reference local_d0;
  tuples local_c0 [16];
  pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>
  local_b0;
  integer_iterator<unsigned_long> local_a0;
  VertexIterator v_end;
  VertexIterator v;
  undefined1 local_88 [8];
  vector<bool,_std::allocator<bool>_> reachable;
  allocator<int> local_49;
  value_type_conflict2 local_48;
  byte local_41;
  vertices_size_type local_40;
  unsigned_long n_vertices;
  vector<long,_std::allocator<long>_> *dist_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pred_local;
  WeightMap *weight_local;
  int *s_local;
  Graph *G_local;
  vector<int,_std::allocator<int>_> *label;
  
  n_vertices = (unsigned_long)dist;
  dist_local = (vector<long,_std::allocator<long>_> *)pred;
  pred_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)weight;
  weight_local = (WeightMap *)s;
  s_local = (int *)G;
  G_local = (Graph *)__return_storage_ptr__;
  vVar7 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                      *)G);
  local_41 = 0;
  local_48 = 4;
  local_40 = vVar7;
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,vVar7,&local_48,&local_49);
  std::allocator<int>::~allocator(&local_49);
  vVar7 = local_40;
  v.m_value._7_1_ = 0;
  this = (allocator<bool> *)((long)&v.m_value + 6);
  std::allocator<bool>::allocator(this);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_88,vVar7,(bool *)((long)&v.m_value + 7),
             this);
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&v.m_value + 6));
  dfs((Graph *)s_local,(int *)weight_local,(vector<bool,_std::allocator<bool>_> *)local_88);
  boost::range_detail::integer_iterator<unsigned_long>::integer_iterator(&v_end);
  boost::range_detail::integer_iterator<unsigned_long>::integer_iterator(&local_a0);
  local_b0 = boost::
             vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                       ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                         *)s_local);
  boost::tuples::
  tie<boost::range_detail::integer_iterator<unsigned_long>,boost::range_detail::integer_iterator<unsigned_long>>
            (local_c0,&v_end,&local_a0);
  boost::tuples::
  tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)local_c0,&local_b0);
  while( true ) {
    tVar5 = boost::iterators::operator!=
                      ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&v_end,
                       (iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&local_a0);
    if (!tVar5) break;
    rVar11 = boost::iterators::detail::
             iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                          *)&v_end);
    this_00 = dist_local;
    if (rVar11 != (long)(int)weight_local->tag) {
      rVar11 = boost::iterators::detail::
               iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                            *)&v_end);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,rVar11);
      vVar2 = *pvVar8;
      rVar11 = boost::iterators::detail::
               iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                            *)&v_end);
      __n = boost::iterators::detail::
            iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
            ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                         *)&v_end);
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_88,__n);
      local_d0 = rVar15;
      bVar6 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
      if ((vVar2 == rVar11) != !bVar6) {
        __assert_fail("(pred[*v] == *v) == (reachable[*v] == false)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                      ,0x8b,
                      "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                     );
      }
      rVar11 = boost::iterators::detail::
               iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                            *)&v_end);
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_88,rVar11);
      local_e0 = rVar15;
      bVar6 = std::_Bit_reference::operator_cast_to_bool(&local_e0);
      if (!bVar6) {
        rVar11 = boost::iterators::detail::
                 iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                 ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                              *)&v_end);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,rVar11);
        *pvVar9 = 1;
      }
    }
    boost::iterators::detail::
    iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                  *)&v_end);
  }
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)dist_local,
                      (long)(int)weight_local->tag);
  if (*pvVar8 == (long)(int)weight_local->tag) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)(int)weight_local->tag);
    *pvVar9 = 0;
  }
  local_f0 = boost::
             vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                       ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                         *)s_local);
  boost::tuples::
  tie<boost::range_detail::integer_iterator<unsigned_long>,boost::range_detail::integer_iterator<unsigned_long>>
            ((tuples *)
             &S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,&v_end,&local_a0);
  boost::tuples::
  tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&S.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node,&local_f0);
  while( true ) {
    tVar5 = boost::iterators::operator!=
                      ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&v_end,
                       (iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&local_a0);
    if (!tVar5) break;
    rVar11 = boost::iterators::detail::
             iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                          *)&v_end);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,rVar11);
    if (*pvVar9 == 4) {
      std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
      stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
                ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)&w)
      ;
      vStack_158 = boost::iterators::detail::
                   iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                   ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                                *)&v_end);
      while( true ) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (__return_storage_ptr__,vStack_158);
        if (*pvVar9 != 4) break;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (__return_storage_ptr__,vStack_158);
        *pvVar9 = 3;
        std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&w,&stack0xfffffffffffffea8);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)dist_local,
                            vStack_158);
        vStack_158 = *pvVar8;
      }
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,vStack_158)
      ;
      z._4_4_ = *pvVar9;
      if (z._4_4_ == 3) {
        do {
          pvVar10 = std::
                    stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                           *)&w);
          local_168 = *pvVar10;
          std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                    ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)&w);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (__return_storage_ptr__,local_168);
          *pvVar9 = 2;
        } while (local_168 != vStack_158);
        while( true ) {
          bVar6 = std::
                  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  empty((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)&w);
          if (((bVar6 ^ 0xffU) & 1) == 0) break;
          pvVar10 = std::
                    stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                           *)&w);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (__return_storage_ptr__,*pvVar10);
          *pvVar9 = -1;
          std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                    ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)&w);
        }
      }
      else {
        if (z._4_4_ == 2) {
          z._4_4_ = -1;
        }
        while( true ) {
          bVar6 = std::
                  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  empty((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)&w);
          iVar1 = z._4_4_;
          if (((bVar6 ^ 0xffU) & 1) == 0) break;
          pvVar10 = std::
                    stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                           *)&w);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (__return_storage_ptr__,*pvVar10);
          *pvVar9 = iVar1;
          std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                    ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)&w);
        }
      }
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
                ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )&w);
    }
    boost::iterators::detail::
    iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                  *)&v_end);
  }
  local_178 = boost::
              vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                        ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                          *)s_local);
  boost::tuples::
  tie<boost::range_detail::integer_iterator<unsigned_long>,boost::range_detail::integer_iterator<unsigned_long>>
            ((tuples *)&w_1,&v_end,&local_a0);
  boost::tuples::
  tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&w_1,&local_178);
  while( true ) {
    tVar5 = boost::iterators::operator!=
                      ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&v_end,
                       (iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&local_a0);
    if (!tVar5) break;
    rVar11 = boost::iterators::detail::
             iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                          *)&v_end);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,rVar11);
    if (*pvVar9 == 2) {
      cycle_length = boost::iterators::detail::
                     iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                     ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                                  *)&v_end);
      local_198 = 0;
      do {
        pvVar4 = pred_local;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)dist_local,
                            cycle_length);
        boost::
        edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                  ((pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> *)
                   &ei.m_g,(boost *)*pvVar8,cycle_length,(vertex_descriptor)s_local,
                   (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                    *)pred);
        e.super_edge_base<boost::directed_tag,_unsigned_long>.m_target = uStack_1d0;
        e.super_edge_base<boost::directed_tag,_unsigned_long>.m_source = (unsigned_long)ei.m_g;
        e.m_eproperty = local_1c8;
        piVar13 = boost::
                  adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_EdgeProperties,_int_EdgeProperties::*>
                  ::operator[]((adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_EdgeProperties,_int_EdgeProperties::*>
                                *)pvVar4,e);
        local_198 = *piVar13 + local_198;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (__return_storage_ptr__,cycle_length);
        *pvVar9 = -2;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)dist_local,
                            cycle_length);
        cycle_length = *pvVar8;
        rVar11 = boost::iterators::detail::
                 iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                 ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                              *)&v_end);
      } while (cycle_length != rVar11);
      if (-1 < local_198) {
        __assert_fail("cycle_length < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                      ,0xbc,
                      "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                     );
      }
    }
    boost::iterators::detail::
    iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                  *)&v_end);
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     (__return_storage_ptr__,(long)(int)weight_local->tag);
  if (*pvVar9 == 0) {
    pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                        ((vector<long,_std::allocator<long>_> *)n_vertices,
                         (long)(int)weight_local->tag);
    if (*pvVar12 != 0) {
      __assert_fail("dist[s] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                    ,0xc0,
                    "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                   );
    }
  }
  boost::detail::
  adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
  ::adj_list_edge_iterator
            ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)&ei_end.m_g);
  boost::detail::
  adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
  ::adj_list_edge_iterator
            ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)local_268);
  boost::
  edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>
            (&local_2f8,(boost *)s_local,g_);
  boost::tuples::
  tie<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>>
            ((tuples *)&v_1,
             (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)&ei_end.m_g,
             (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)local_268);
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&v_1,&local_2f8);
  std::
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  ::~pair(&local_2f8);
  do {
    bVar6 = boost::detail::
            adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
            ::operator!=((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                          *)&ei_end.m_g,(self *)local_268);
    if (!bVar6) {
      local_41 = 1;
      boost::detail::
      adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
      ::~adj_list_edge_iterator
                ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                  *)local_268);
      boost::detail::
      adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
      ::~adj_list_edge_iterator
                ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                  *)&ei_end.m_g);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_88);
      if ((local_41 & 1) == 0) {
        std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator*((value_type *)&w_2,
                (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                 *)&ei_end.m_g);
    local_310 = boost::
                source<boost::directed_tag,unsigned_long,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                          ((edge_base<boost::directed_tag,_unsigned_long> *)&w_2,
                           (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                            *)s_local);
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator*(&local_348,
                (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                 *)&ei_end.m_g);
    local_330 = boost::
                target<boost::directed_tag,unsigned_long,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                          (&local_348.super_edge_base<boost::directed_tag,_unsigned_long>,
                           (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                            *)s_local);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,local_330);
    if (*pvVar9 == 0) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,local_310);
      bVar6 = true;
      if (*pvVar9 != 0) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (__return_storage_ptr__,local_310);
        bVar6 = *pvVar9 == 1;
      }
      if (!bVar6) {
        __assert_fail("label[v] == FINITE || label[v] == PLUS",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                      ,199,
                      "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                     );
      }
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,local_310);
      if (*pvVar9 == 0) {
        pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                            ((vector<long,_std::allocator<long>_> *)n_vertices,local_310);
        pvVar4 = pred_local;
        lVar3 = *pvVar12;
        boost::detail::
        adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
        ::operator*(&local_360,
                    (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                     *)&ei_end.m_g);
        e_00.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
             local_360.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
        e_00.super_edge_base<boost::directed_tag,_unsigned_long>.m_source =
             local_360.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
        e_00.m_eproperty = local_360.m_eproperty;
        piVar13 = boost::
                  adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_EdgeProperties,_int_EdgeProperties::*>
                  ::operator[]((adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_EdgeProperties,_int_EdgeProperties::*>
                                *)pvVar4,e_00);
        iVar1 = *piVar13;
        pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                            ((vector<long,_std::allocator<long>_> *)n_vertices,local_330);
        if (lVar3 + iVar1 < *pvVar12) {
          __assert_fail("dist[v] + weight[*ei] >= dist[w]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                        ,0xca,
                        "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                       );
        }
        boost::detail::
        adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
        ::operator*(&local_378,
                    (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                     *)&ei_end.m_g);
        uVar14 = boost::
                 source<boost::directed_tag,unsigned_long,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                           (&local_378.super_edge_base<boost::directed_tag,_unsigned_long>,
                            (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                             *)s_local);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)dist_local,
                            local_330);
        if (uVar14 == *pvVar8) {
          pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                              ((vector<long,_std::allocator<long>_> *)n_vertices,local_310);
          pvVar4 = pred_local;
          lVar3 = *pvVar12;
          boost::detail::
          adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
          ::operator*(&local_390,
                      (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                       *)&ei_end.m_g);
          e_01.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
               local_390.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
          e_01.super_edge_base<boost::directed_tag,_unsigned_long>.m_source =
               local_390.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
          e_01.m_eproperty = local_390.m_eproperty;
          piVar13 = boost::
                    adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_EdgeProperties,_int_EdgeProperties::*>
                    ::operator[]((adj_list_edge_property_map<boost::directed_tag,_int,_int_&,_unsigned_long,_EdgeProperties,_int_EdgeProperties::*>
                                  *)pvVar4,e_01);
          iVar1 = *piVar13;
          pvVar12 = std::vector<long,_std::allocator<long>_>::operator[]
                              ((vector<long,_std::allocator<long>_> *)n_vertices,local_330);
          if (lVar3 + iVar1 != *pvVar12) {
            __assert_fail("dist[v] + weight[*ei] == dist[w]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/rafaelglikis[P]bellman-ford-boost/src/bellman_ford.cpp"
                          ,0xce,
                          "std::vector<int> CHECK_BELLMAN_FORD(const Graph &, const int &, const WeightMap &, std::vector<unsigned long> &, std::vector<long> &)"
                         );
          }
        }
      }
    }
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator++((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                  *)&ei_end.m_g);
  } while( true );
}

Assistant:

std::vector<int> CHECK_BELLMAN_FORD(const Graph& G, const int& s, const WeightMap& weight, std::vector<unsigned long>& pred, std::vector<long>& dist)
{
    // init
    unsigned long  n_vertices = num_vertices(G);
    enum{ NEG_CYCLE = -2, ATT_TO_CYCLE = -1, FINITE = 0, PLUS = 1, CYCLE = 2, ON_CUR_PATH = 3, UNKNOWN = 4 };
    std::vector<int> label(n_vertices, UNKNOWN);
    std::vector<bool> reachable(n_vertices, false);

    dfs(G,s,reachable);
    VertexIterator v, v_end;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        if (*v != s) {
            // if v in V+, their is a path s-v
            assert( (pred[*v] == *v) == (reachable[*v] == false));
            if (reachable[*v] == false) label[*v]=PLUS;
        }
    }

    // classification of nodes
    if (pred[s]==s) label[s]=FINITE;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        if(label[*v]==UNKNOWN) {
            std::stack<Vertex> S;
            Vertex w = *v;
            while (label[w]==UNKNOWN) {
                label[w]=ON_CUR_PATH;
                S.push(w);
                w = pred[w];
            }
            // label all nodes on current path
            int t = label[w];
            if ( t == ON_CUR_PATH ) {
                Vertex z;
                do { 
                    z = S.top(); S.pop();
                    label[z] = CYCLE;
                } while ( z != w );

                while ( !S.empty() ) {
                    label[S.top()] = ATT_TO_CYCLE;
                    S.pop();
                }
            } else { // t is CYCLE, ATT_TO_CYCLE, or FINITE
                if ( t == CYCLE ) t = ATT_TO_CYCLE;
                while ( !S.empty() ) {
                    label[S.top()] = t;
                    S.pop();
                }
            }
        }
    }

    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
         if ( label[*v] == CYCLE ){
            Vertex w = *v;
            long cycle_length = 0;
            do { 
                cycle_length += weight[edge(pred[w], w, G).first];
                label[w] = NEG_CYCLE;
                w = pred[w];
            } while (w != *v);
            // All cycles in P have negative weight
            assert(cycle_length < 0);
         }
    }

    if ( label[s] == FINITE ) assert(dist[s] == 0);
    EdgeIterator ei, ei_end;
    for (tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei){
        Vertex v = source(*ei, G);
        Vertex w = target(*ei, G);
        if ( label[w] == FINITE ) {
            // Their is no edge(v,w) where v in V- and w in Vf
            assert( label[v] == FINITE || label[v] == PLUS);
            // For each e(v,w) if v and w in Vf, dist[v] + weight[e] >= dist[w]
            if ( label[v] == FINITE ) {
                assert( dist[v] + weight[*ei] >= dist[w] );
                // For each vertex v in Vf,
                // If v=s then dist[v]=0
                // Else dist[v] = dist[u] + weight[edge(u,v)]
                if ( source(*ei, G) == pred[w] ) assert( dist[v] + weight[*ei] == dist[w] );
            }
        }
    }

    return label;
}